

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
::internal_emplace<int_const&>
          (btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
           *this,iterator iter,int *args)

{
  template_ElementType<1UL> tVar1;
  undefined4 uVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  field_type fVar9;
  node_type *this_00;
  slot_type *psVar10;
  slot_type *psVar11;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  **ppbVar12;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  **ppbVar13;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  **ppbVar14;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  *pbVar15;
  template_ElementType<1UL> *ptVar16;
  template_ElementType<1UL> *ptVar17;
  undefined7 extraout_var;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  *pbVar18;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  *alloc;
  int **args_00;
  allocator_type *extraout_RDX;
  allocator_type *alloc_00;
  allocator_type *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar19;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  *pbVar20;
  allocator_type *in_R9;
  long lVar21;
  ulong uVar22;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  *pbVar23;
  size_type sVar24;
  ulong i;
  iterator iVar25;
  iterator iter_local;
  slot_type *local_38;
  
  pbVar20 = iter.node;
  iter_local.position = iter.position;
  args_00 = (int **)args;
  iter_local.node = pbVar20;
  bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::leaf(pbVar20);
  if (!bVar3) {
    btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
    ::operator--(&iter_local);
    iter_local.position = iter_local.position + 1;
    pbVar20 = iter_local.node;
  }
  bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::max_count(pbVar20);
  bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::count(iter_local.node);
  if (bVar5 == bVar4) {
    if (bVar4 < 0x3d) {
      if (iter_local.node !=
          *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
            **)this) {
        __assert_fail("iter.node == root()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xc27,
                      "iterator phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>, Args = <const int &>]"
                     );
      }
      bVar5 = 0x3d;
      if ((byte)(bVar4 * '\x02') < 0x3d) {
        bVar5 = bVar4 * '\x02';
      }
      this_00 = btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                ::new_leaf_root_node
                          ((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                            *)this,(uint)bVar5);
      pbVar20 = *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                  **)this;
      iter_local.node = this_00;
      bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::leaf(this_00);
      bVar6 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::leaf(pbVar20);
      if (bVar3 != bVar6) {
        __assert_fail("leaf() == x->leaf()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x942,
                      "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>>::swap(btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>]"
                     );
      }
      bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::count(this_00);
      bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::count(pbVar20);
      pbVar23 = this_00;
      pbVar18 = pbVar20;
      if (bVar4 <= bVar5) {
        pbVar23 = pbVar20;
        pbVar18 = this_00;
      }
      psVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                ::slot(pbVar18,0);
      psVar11 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                ::slot(pbVar23,0);
      bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::count(pbVar18);
      for (lVar21 = 0; (ulong)bVar4 * 4 != lVar21; lVar21 = lVar21 + 4) {
        uVar2 = *(undefined4 *)((long)psVar10 + lVar21);
        *(undefined4 *)((long)psVar10 + lVar21) = *(undefined4 *)((long)psVar11 + lVar21);
        *(undefined4 *)((long)psVar11 + lVar21) = uVar2;
      }
      bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::count(pbVar23);
      bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::count(pbVar18);
      bVar7 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::count(pbVar18);
      bVar8 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::count(pbVar18);
      alloc = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
               *)(ulong)bVar8;
      btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
      ::uninitialized_move_n
                (pbVar23,(ulong)bVar4 - (ulong)bVar5,(ulong)bVar7,(size_type)alloc,pbVar18,in_R9);
      bVar7 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::count(pbVar18);
      btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
      ::value_destroy_n(pbVar23,(ulong)bVar7,(ulong)bVar4 - (ulong)bVar5,(allocator_type *)alloc);
      bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::leaf(this_00);
      if (!bVar3) {
        ppbVar12 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                   ::mutable_child(pbVar18,0);
        bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                ::count(pbVar18);
        ppbVar13 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                   ::mutable_child(pbVar18,(ulong)bVar4 + 1);
        ppbVar14 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                   ::mutable_child(pbVar23,0);
        for (; ppbVar12 != ppbVar13; ppbVar12 = ppbVar12 + 1) {
          alloc = *ppbVar12;
          *ppbVar12 = *ppbVar14;
          *ppbVar14 = alloc;
          ppbVar14 = ppbVar14 + 1;
        }
        for (sVar24 = 0;
            bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                    ::count(pbVar18), sVar24 <= bVar4; sVar24 = sVar24 + 1) {
          pbVar15 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                    ::child(pbVar18,sVar24);
          btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::set_parent(pbVar15,pbVar18);
          pbVar15 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                    ::child(pbVar23,sVar24);
          btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::set_parent(pbVar15,pbVar23);
        }
        for (; bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                       ::count(pbVar23), sVar24 <= bVar4; sVar24 = sVar24 + 1) {
          pbVar15 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                    ::child(pbVar23,sVar24);
          btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::init_child(pbVar18,(int)sVar24,pbVar15);
          btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::mutable_child(pbVar23,sVar24);
        }
      }
      ptVar16 = btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
                ::GetField<1ul>((btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
                                 *)this_00);
      ptVar17 = btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
                ::GetField<1ul>((btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
                                 *)pbVar20);
      tVar1 = ptVar16[2];
      args_00 = (int **)CONCAT71((int7)((ulong)alloc >> 8),tVar1);
      ptVar16[2] = ptVar17[2];
      ptVar17[2] = tVar1;
      btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
      ::delete_leaf_node((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                          *)this,*(node_type **)this);
      *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
        **)this = iter_local.node;
      *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
        **)(this + 8) = iter_local.node;
    }
    else {
      btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
      ::rebalance_or_split
                ((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                  *)this,&iter_local);
    }
  }
  pbVar20 = iter_local.node;
  uVar22 = (ulong)iter_local.position;
  bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::count(iter_local.node);
  if (uVar22 <= bVar4) {
    bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
            ::count(pbVar20);
    if (uVar22 < bVar4) {
      bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::count(pbVar20);
      bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::count(pbVar20);
      local_38 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                 ::slot(pbVar20,(ulong)bVar5 - 1);
      btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
      ::value_init<int*>((btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
                          *)pbVar20,(ulong)bVar4,(allocator_type *)&local_38,args_00);
      bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::count(pbVar20);
      alloc_00 = extraout_RDX;
      for (sVar24 = (ulong)bVar4 - 2; uVar22 < sVar24 + 1; sVar24 = sVar24 - 1) {
        psVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                  ::slot(pbVar20,sVar24);
        psVar11 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                  ::slot(pbVar20,sVar24 + 1);
        *psVar11 = *psVar10;
        alloc_00 = extraout_RDX_00;
      }
      btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
      ::value_destroy(pbVar20,uVar22,alloc_00);
    }
    btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
    ::slot(pbVar20,uVar22);
    psVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::slot(pbVar20,uVar22);
    *psVar10 = *args;
    fVar9 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
            ::count(pbVar20);
    ptVar16 = btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
              ::GetField<1ul>((btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
                               *)pbVar20);
    ptVar16[2] = fVar9 + '\x01';
    bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
            ::leaf(pbVar20);
    pbVar18 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
               *)CONCAT71(extraout_var,bVar3);
    uVar19 = extraout_RDX_01;
    if (!bVar3) {
      bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::count(pbVar20);
      pbVar18 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                 *)(ulong)bVar4;
      pbVar23 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                 *)(uVar22 + 1);
      uVar19 = extraout_RDX_02;
      if (pbVar23 < pbVar18) {
        bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                ::count(pbVar20);
        uVar22 = (ulong)bVar4;
        while ((int)pbVar23 < (int)uVar22) {
          i = (ulong)((int)uVar22 - 1);
          pbVar18 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                    ::child(pbVar20,i);
          btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::set_child(pbVar20,uVar22,pbVar18);
          uVar22 = i;
        }
        pbVar18 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                   *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                     ::mutable_child(pbVar20,(size_type)pbVar23);
        uVar19 = extraout_RDX_03;
      }
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    iVar25._8_8_ = uVar19;
    iVar25.node = pbVar18;
    return iVar25;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x852,
                "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>, Args = <const int &>]"
               );
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&... args)
        -> iterator {
        if (!iter.node->leaf()) {
            // We can't insert on an internal node. Instead, we'll insert after the
            // previous value which is guaranteed to be on a leaf node.
            --iter;
            ++iter.position;
        }
        const int max_count = iter.node->max_count();
        if (iter.node->count() == max_count) {
            // Make room in the leaf for the new item.
            if (max_count < kNodeValues) {
                // Insertion into the root where the root is smaller than the full node
                // size. Simply grow the size of the root node.
                assert(iter.node == root());
                iter.node =
                    new_leaf_root_node((std::min<int>)(kNodeValues, 2 * max_count));
                iter.node->swap(root(), mutable_allocator());
                delete_leaf_node(root());
                mutable_root() = iter.node;
                rightmost_ = iter.node;
            } else {
                rebalance_or_split(&iter);
            }
        }
        iter.node->emplace_value(iter.position, mutable_allocator(),
                                 std::forward<Args>(args)...);
        ++size_;
        return iter;
    }